

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonDocument.cpp
# Opt level: O0

void json::JsonDocument::writeNode(ostream *output,JsonNode *node,string *indent,size_t tabSize)

{
  JsonNode *pJVar1;
  bool bVar2;
  int iVar3;
  JsonArray *this;
  size_t sVar4;
  undefined4 extraout_var;
  JsonObject *this_00;
  size_type sVar5;
  reference pvVar6;
  undefined4 extraout_var_00;
  bool *pbVar7;
  undefined4 extraout_var_01;
  double *pdVar8;
  ostream *poVar9;
  char *pcVar10;
  undefined1 local_198 [64];
  reference local_158;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>
  *pair;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
  *__range3_1;
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
  children;
  string local_118 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8 [8];
  string newIndent_1;
  JsonObject *object;
  string local_c8 [32];
  JsonNode *local_a8;
  JsonNode *child;
  const_iterator __end3;
  const_iterator __begin3;
  JsonArray *__range3;
  allocator local_71;
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [8];
  string newIndent;
  JsonArray *array;
  size_t tabSize_local;
  string *indent_local;
  JsonNode *node_local;
  ostream *output_local;
  
  iVar3 = (*node->_vptr_JsonNode[2])();
  switch(iVar3) {
  case 0:
    this = JsonNode::operator_cast_to_JsonArray_(node);
    std::operator<<(output,'[');
    bVar2 = JsonArray::empty(this);
    if (!bVar2) {
      std::operator<<(output,'\n');
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,tabSize,' ',&local_71);
    std::operator+(local_50,indent);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    __end3.it._M_current = (const_iterator)JsonArray::begin(this);
    child = (JsonNode *)JsonArray::end(this);
    while (bVar2 = JsonArray::const_iterator::operator!=(&__end3,(const_iterator *)&child), bVar2) {
      local_a8 = JsonArray::const_iterator::operator*(&__end3);
      std::operator<<(output,(string *)local_50);
      pJVar1 = local_a8;
      std::__cxx11::string::string(local_c8,(string *)local_50);
      writeNode(output,pJVar1,(string *)local_c8,tabSize);
      std::__cxx11::string::~string(local_c8);
      pJVar1 = local_a8;
      sVar4 = JsonArray::getChildCount(this);
      iVar3 = (*(this->super_JsonNode)._vptr_JsonNode[0x10])(this,sVar4 - 1);
      if (pJVar1 != (JsonNode *)CONCAT44(extraout_var,iVar3)) {
        std::operator<<(output,',');
      }
      std::operator<<(output,'\n');
      JsonArray::const_iterator::operator++(&__end3);
    }
    bVar2 = JsonArray::empty(this);
    if (!bVar2) {
      std::operator<<(output,(string *)indent);
    }
    std::operator<<(output,']');
    std::__cxx11::string::~string((string *)local_50);
    break;
  case 1:
    this_00 = JsonNode::operator_cast_to_JsonObject_(node);
    std::operator<<(output,'{');
    bVar2 = JsonObject::empty(this_00);
    if (!bVar2) {
      std::operator<<(output,'\n');
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_118,tabSize,' ',
               (allocator *)
               ((long)&children.
                       super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::operator+(local_f8,indent);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&children.
                       super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    JsonObject::sort_abi_cxx11_
              ((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
                *)&__range3_1,this_00);
    __end3_1 = std::
               vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
               ::begin((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
                        *)&__range3_1);
    pair = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>
            *)std::
              vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
              ::end((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
                     *)&__range3_1);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>_>
                               *)&pair), bVar2) {
      local_158 = __gnu_cxx::
                  __normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>_>
                  ::operator*(&__end3_1);
      poVar9 = std::operator<<(output,(string *)local_f8);
      poVar9 = std::operator<<(poVar9,'\"');
      poVar9 = std::operator<<(poVar9,(string *)local_158->first);
      poVar9 = std::operator<<(poVar9,'\"');
      std::operator<<(poVar9,": ");
      pJVar1 = local_158->second;
      std::__cxx11::string::string((string *)(local_198 + 0x20),(string *)local_f8);
      writeNode(output,pJVar1,(string *)(local_198 + 0x20),tabSize);
      std::__cxx11::string::~string((string *)(local_198 + 0x20));
      pJVar1 = local_158->second;
      sVar5 = std::
              vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
              ::size((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
                      *)&__range3_1);
      pvVar6 = std::
               vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
               ::operator[]((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
                             *)&__range3_1,sVar5 - 1);
      if (pJVar1 != pvVar6->second) {
        std::operator<<(output,',');
      }
      std::operator<<(output,'\n');
      __gnu_cxx::
      __normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>_>
      ::operator++(&__end3_1);
    }
    bVar2 = JsonObject::empty(this_00);
    if (!bVar2) {
      std::operator<<(output,(string *)indent);
    }
    std::operator<<(output,'}');
    std::
    vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
    ::~vector((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
               *)&__range3_1);
    std::__cxx11::string::~string((string *)local_f8);
    break;
  case 2:
    iVar3 = (*node->_vptr_JsonNode[8])();
    pbVar7 = JsonBool::operator_cast_to_bool_((JsonBool *)CONCAT44(extraout_var_00,iVar3));
    pcVar10 = "false";
    if ((*pbVar7 & 1U) != 0) {
      pcVar10 = "true";
    }
    std::operator<<(output,pcVar10);
    break;
  case 3:
    std::operator<<(output,"null");
    break;
  case 4:
    iVar3 = (*node->_vptr_JsonNode[0xc])();
    pdVar8 = JsonNumber::operator_cast_to_double_((JsonNumber *)CONCAT44(extraout_var_01,iVar3));
    std::ostream::operator<<(output,*pdVar8);
    break;
  case 5:
    poVar9 = std::operator<<(output,'\"');
    (*node->_vptr_JsonNode[0xe])();
    JsonString::escaped_abi_cxx11_((JsonString *)local_198);
    poVar9 = std::operator<<(poVar9,(string *)local_198);
    std::operator<<(poVar9,'\"');
    std::__cxx11::string::~string((string *)local_198);
  }
  return;
}

Assistant:

void JsonDocument::writeNode(std::ostream &output, const JsonNode &node, std::string indent, size_t tabSize)
    {
        switch (node.getType())
        {
        case JsonNodeType::Array:
        {
            const JsonArray &array = node;

            output << '[';

            // If the array is empty we would like to print [] without a newline in the middle.
            if (!array.empty())
                output << '\n';

            // Calculate new indent for child nodes.
            std::string newIndent = indent + std::string(tabSize, ' ');

            for (const JsonNode &child : array)
            {
                output << newIndent;
                writeNode(output, child, newIndent, tabSize);
                if (&child != &array[array.getChildCount() - 1]) // If last child don't print ','.
                    output << ',';
                output << '\n';
            }

            // Same reasoning as previous array.empty() check, we don't want spaces in the middle of [].
            if (!array.empty())
                output << indent;

            output << ']';
        }
        break;
        case JsonNodeType::Object:
        {
            const JsonObject &object = node;
            output << '{';

            if (!object.empty())
                output << '\n';

            std::string newIndent = indent + std::string(tabSize, ' ');

            // We want the pairs to be printed based on the insertion order therefore we sort the object first.
            // This is not necessary and will have a performance cost, but it's pretty and therefore we do it.
            std::vector<std::pair<const std::string &, const JsonNode &>> children = object.sort();
            for (const auto &pair : children)
            {
                output << newIndent << '\"' << pair.first << '\"' << ": ";
                writeNode(output, pair.second, newIndent, tabSize);
                if (&pair.second != &children[children.size() - 1].second)
                    output << ',';
                output << '\n';
            }

            if (!object.empty())
                output << indent;

            output << '}';
        }
        break;
        case JsonNodeType::Bool:
            output << (node.toBool() ? "true" : "false");
            break;
        case JsonNodeType::Null:
            output << "null";
            break;
        case JsonNodeType::Number:
            output << node.toNumber();
            break;
        case JsonNodeType::String:
            output << '\"' << node.toString().escaped() << '\"';
            break;
        }
    }